

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# processestimator.cxx
# Opt level: O3

Matrix * __thiscall
ProcessEstimator::getEstimate(Matrix *__return_storage_ptr__,ProcessEstimator *this,Property *p)

{
  double dVar1;
  uint uVar2;
  StochasticProcess *pSVar3;
  pointer pcVar4;
  uint uVar5;
  int iVar6;
  long *plVar7;
  undefined8 *puVar8;
  ulong uVar9;
  size_type *psVar10;
  long *plVar11;
  pointer *ppcVar12;
  pointer pcVar13;
  pointer pcVar14;
  ulong uVar15;
  int i;
  ulong uVar16;
  Physical p_1;
  Unit unit;
  string name;
  Graph a;
  pointer *local_d68;
  long local_d60;
  pointer local_d58;
  undefined4 uStack_d50;
  undefined4 uStack_d4c;
  long *local_d48;
  undefined8 local_d40;
  long local_d38;
  undefined8 uStack_d30;
  string local_d28;
  double local_d08;
  double local_d00;
  pointer *local_cf8;
  long local_cf0;
  pointer local_ce8 [2];
  undefined1 local_cd8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_cc0 [14];
  Matrix *local_bd8;
  long *local_bd0;
  long local_bc8;
  long local_bc0;
  long lStack_bb8;
  string local_bb0;
  long *local_b90 [2];
  long local_b80 [2];
  string local_b70;
  Matrix local_b50;
  undefined1 local_a50 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_a38 [14];
  Matrix local_950;
  Unit local_850;
  Physical local_7e8;
  Physical local_750;
  Physical local_6b8;
  Physical local_620;
  Physical local_588;
  Physical local_4f0;
  Physical local_458;
  Physical local_3c0;
  Physical local_328;
  Physical local_290;
  Physical local_1f8;
  Physical local_160;
  Physical local_c8;
  
  uVar5 = (this->super_Estimator).nEstimate;
  uVar2 = (this->super_Estimator).nSamples;
  if (uVar2 == 0) {
    local_d08 = 1.0;
  }
  else {
    local_d08 = (double)uVar2;
  }
  if ((uVar5 & 0x40) != 0) {
    local_d08 = local_d08 * ((this->super_Estimator).estimatorTime)->dt;
  }
  uVar5 = uVar5 & *p;
  if ((uVar5 & 1) == 0) {
    if ((uVar5 & 4) == 0) {
      if ((uVar5 & 8) != 0) {
        Matrix::Matrix(&local_950,this->nLength,2);
        local_950.super_Physical._vptr_Physical = (_func_int **)&PTR__Matrix_0015b990;
        local_cd8._0_8_ = local_cd8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_cd8,"process variance","");
        Matrix::setName(&local_950,(string *)local_cd8);
        if ((undefined1 *)local_cd8._0_8_ != local_cd8 + 0x10) {
          operator_delete((void *)local_cd8._0_8_,local_cd8._16_8_ + 1);
        }
        pSVar3 = (this->super_Estimator).pSource;
        if (pSVar3 != (StochasticProcess *)0x0) {
          (*(pSVar3->super_Physical)._vptr_Physical[10])(local_cd8,&pSVar3->super_Physical);
          Unit::getName_abi_cxx11_((string *)local_a50,(Unit *)local_cd8);
          Unit::~Unit((Unit *)local_cd8);
          pSVar3 = (this->super_Estimator).pSource;
          (*(pSVar3->super_Physical)._vptr_Physical[10])(&local_b50,&pSVar3->super_Physical);
          local_b70._M_dataplus._M_p = (pointer)&local_b70.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_b70,local_a50._0_8_,
                     (pointer)(local_a50._8_8_ + local_a50._0_8_));
          operator*(&local_850,(Unit *)&local_b50,(Unit *)&local_b50);
          Physical::Physical((Physical *)local_cd8,&local_b70,&local_850);
          Unit::~Unit(&local_850);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b70._M_dataplus._M_p != &local_b70.field_2) {
            operator_delete(local_b70._M_dataplus._M_p,local_b70.field_2._M_allocated_capacity + 1);
          }
          pSVar3 = (this->super_Estimator).pSource;
          pcVar13 = (pSVar3->super_Parametric).parametricName._M_dataplus._M_p;
          local_b90[0] = local_b80;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_b90,pcVar13,
                     pcVar13 + (pSVar3->super_Parametric).parametricName._M_string_length);
          plVar7 = (long *)std::__cxx11::string::replace((ulong)local_b90,0,(char *)0x0,0x14c0ec);
          plVar11 = plVar7 + 2;
          if ((long *)*plVar7 == plVar11) {
            local_bc0 = *plVar11;
            lStack_bb8 = plVar7[3];
            local_bd0 = &local_bc0;
          }
          else {
            local_bc0 = *plVar11;
            local_bd0 = (long *)*plVar7;
          }
          local_bc8 = plVar7[1];
          *plVar7 = (long)plVar11;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_bd0);
          ppcVar12 = (pointer *)(plVar7 + 2);
          if ((pointer *)*plVar7 == ppcVar12) {
            local_d58 = *ppcVar12;
            uStack_d50 = (undefined4)plVar7[3];
            uStack_d4c = *(undefined4 *)((long)plVar7 + 0x1c);
            local_d68 = &local_d58;
          }
          else {
            local_d58 = *ppcVar12;
            local_d68 = (pointer *)*plVar7;
          }
          local_d60 = plVar7[1];
          *plVar7 = (long)ppcVar12;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          pSVar3 = (this->super_Estimator).pSource;
          pcVar13 = (pSVar3->super_Parametric).parametricType._M_dataplus._M_p;
          local_cf8 = local_ce8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_cf8,pcVar13,
                     pcVar13 + (pSVar3->super_Parametric).parametricType._M_string_length);
          pcVar13 = (pointer)0xf;
          if (local_d68 != &local_d58) {
            pcVar13 = local_d58;
          }
          if (pcVar13 < (pointer)(local_cf0 + local_d60)) {
            pcVar13 = (pointer)0xf;
            if (local_cf8 != local_ce8) {
              pcVar13 = local_ce8[0];
            }
            if (pcVar13 < (pointer)(local_cf0 + local_d60)) goto LAB_0014193e;
            puVar8 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_cf8,0,(char *)0x0,(ulong)local_d68)
            ;
          }
          else {
LAB_0014193e:
            puVar8 = (undefined8 *)
                     std::__cxx11::string::_M_append((char *)&local_d68,(ulong)local_cf8);
          }
          local_d48 = &local_d38;
          plVar7 = puVar8 + 2;
          if ((long *)*puVar8 == plVar7) {
            local_d38 = *plVar7;
            uStack_d30 = puVar8[3];
          }
          else {
            local_d38 = *plVar7;
            local_d48 = (long *)*puVar8;
          }
          local_d40 = puVar8[1];
          *puVar8 = plVar7;
          puVar8[1] = 0;
          *(undefined1 *)plVar7 = 0;
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_d48);
          psVar10 = (size_type *)(plVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar10) {
            local_d28.field_2._M_allocated_capacity = *psVar10;
            local_d28.field_2._8_8_ = plVar7[3];
            local_d28._M_dataplus._M_p = (pointer)&local_d28.field_2;
          }
          else {
            local_d28.field_2._M_allocated_capacity = *psVar10;
            local_d28._M_dataplus._M_p = (pointer)*plVar7;
          }
          local_d28._M_string_length = plVar7[1];
          *plVar7 = (long)psVar10;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          Matrix::setName(&local_950,&local_d28);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d28._M_dataplus._M_p != &local_d28.field_2) {
            operator_delete(local_d28._M_dataplus._M_p,local_d28.field_2._M_allocated_capacity + 1);
          }
          if (local_d48 != &local_d38) {
            operator_delete(local_d48,local_d38 + 1);
          }
          if (local_cf8 != local_ce8) {
            operator_delete(local_cf8,(ulong)(local_ce8[0] + 1));
          }
          if (local_d68 != &local_d58) {
            operator_delete(local_d68,(ulong)(local_d58 + 1));
          }
          if (local_bd0 != &local_bc0) {
            operator_delete(local_bd0,local_bc0 + 1);
          }
          if (local_b90[0] != local_b80) {
            operator_delete(local_b90[0],local_b80[0] + 1);
          }
          Physical::Physical(&local_458,(Physical *)local_cd8);
          Matrix::setPhysical(&local_950,&local_458);
          Physical::~Physical(&local_458);
          Physical::Physical(&local_4f0,&((this->super_Estimator).estimatorTime)->super_Physical);
          Matrix::setPhysical(&local_950,0,&local_4f0);
          Physical::~Physical(&local_4f0);
          Physical::Physical(&local_588,(Physical *)local_cd8);
          Matrix::setPhysical(&local_950,1,&local_588);
          Physical::~Physical(&local_588);
          Physical::~Physical((Physical *)local_cd8);
          Unit::~Unit((Unit *)&local_b50);
          if ((undefined1 *)local_a50._0_8_ != local_a50 + 0x10) {
            operator_delete((void *)local_a50._0_8_,(ulong)(local_a50._16_8_ + 1));
          }
        }
        if (this->nLength != 0) {
          uVar15 = 0;
          do {
            dVar1 = ((this->super_Estimator).estimatorTime)->dt;
            Matrix::operator[](&local_b50,&local_950,(int)uVar15);
            Matrix::operator[]((Matrix *)local_cd8,&local_b50,0);
            Matrix::operator=((Matrix *)local_cd8,(double)(uVar15 & 0xffffffff) * dVar1);
            Matrix::~Matrix((Matrix *)local_cd8);
            Matrix::~Matrix(&local_b50);
            dVar1 = this->aTwo[uVar15];
            local_d00 = this->aOne[uVar15];
            Matrix::operator[](&local_b50,&local_950,(int)uVar15);
            Matrix::operator[]((Matrix *)local_cd8,&local_b50,1);
            Matrix::operator=((Matrix *)local_cd8,
                              dVar1 / local_d08 - ((local_d00 / local_d08) * local_d00) / local_d08)
            ;
            Matrix::~Matrix((Matrix *)local_cd8);
            Matrix::~Matrix(&local_b50);
            uVar15 = uVar15 + 1;
          } while (uVar15 < this->nLength);
        }
        Matrix::Matrix(__return_storage_ptr__,&local_950);
        goto LAB_00142222;
      }
      if ((uVar5 & 2) == 0) {
        Matrix::Matrix(__return_storage_ptr__);
        return __return_storage_ptr__;
      }
      Graph::Graph((Graph *)&local_950,this->nLength,(int)this->nDist);
      pcVar13 = local_cd8 + 0x10;
      local_cd8._0_8_ = pcVar13;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_cd8,"process density","");
      Matrix::setName(&local_950,(string *)local_cd8);
      local_bd8 = __return_storage_ptr__;
      if ((pointer)local_cd8._0_8_ != pcVar13) {
        operator_delete((void *)local_cd8._0_8_,local_cd8._16_8_ + 1);
      }
      pSVar3 = (this->super_Estimator).pSource;
      if (pSVar3 != (StochasticProcess *)0x0) {
        pcVar4 = (pSVar3->super_Parametric).parametricName._M_dataplus._M_p;
        local_d48 = &local_d38;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_d48,pcVar4,
                   pcVar4 + (pSVar3->super_Parametric).parametricName._M_string_length);
        plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_d48,0,(char *)0x0,0x14c119);
        psVar10 = (size_type *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar10) {
          local_d28.field_2._M_allocated_capacity = *psVar10;
          local_d28.field_2._8_8_ = plVar7[3];
          local_d28._M_dataplus._M_p = (pointer)&local_d28.field_2;
        }
        else {
          local_d28.field_2._M_allocated_capacity = *psVar10;
          local_d28._M_dataplus._M_p = (pointer)*plVar7;
        }
        local_d28._M_string_length = plVar7[1];
        *plVar7 = (long)psVar10;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_d28);
        pcVar4 = local_a50 + 0x10;
        plVar11 = plVar7 + 2;
        if ((long *)*plVar7 == plVar11) {
          local_a50._16_8_ = *plVar11;
          aaStack_a38[0]._0_4_ = (undefined4)plVar7[3];
          aaStack_a38[0]._4_4_ = *(undefined4 *)((long)plVar7 + 0x1c);
          local_a50._0_8_ = pcVar4;
        }
        else {
          local_a50._16_8_ = *plVar11;
          local_a50._0_8_ = (long *)*plVar7;
        }
        local_a50._8_8_ = plVar7[1];
        *plVar7 = (long)plVar11;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        pSVar3 = (this->super_Estimator).pSource;
        pcVar14 = (pSVar3->super_Parametric).parametricType._M_dataplus._M_p;
        local_d68 = &local_d58;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_d68,pcVar14,
                   pcVar14 + (pSVar3->super_Parametric).parametricType._M_string_length);
        pcVar14 = (pointer)0xf;
        if ((pointer)local_a50._0_8_ != pcVar4) {
          pcVar14 = (pointer)local_a50._16_8_;
        }
        if (pcVar14 < (pointer)(local_a50._8_8_ + local_d60)) {
          pcVar14 = (pointer)0xf;
          if (local_d68 != &local_d58) {
            pcVar14 = local_d58;
          }
          if (pcVar14 < (pointer)(local_a50._8_8_ + local_d60)) goto LAB_00141db9;
          puVar8 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_d68,0,(char *)0x0,local_a50._0_8_);
        }
        else {
LAB_00141db9:
          puVar8 = (undefined8 *)std::__cxx11::string::_M_append(local_a50,(ulong)local_d68);
        }
        local_b50.super_Physical._vptr_Physical =
             (_func_int **)&local_b50.super_Physical.physicalDescription._M_string_length;
        psVar10 = puVar8 + 2;
        if ((size_type *)*puVar8 == psVar10) {
          local_b50.super_Physical.physicalDescription._M_string_length = *psVar10;
          local_b50.super_Physical.physicalDescription.field_2._M_allocated_capacity = puVar8[3];
        }
        else {
          local_b50.super_Physical.physicalDescription._M_string_length = *psVar10;
          local_b50.super_Physical._vptr_Physical = (_func_int **)*puVar8;
        }
        local_b50.super_Physical.physicalDescription._M_dataplus._M_p = (pointer)puVar8[1];
        *puVar8 = psVar10;
        puVar8[1] = 0;
        *(undefined1 *)psVar10 = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_b50);
        psVar10 = (size_type *)(plVar7 + 2);
        if ((size_type *)*plVar7 == psVar10) {
          local_cd8._16_8_ = *psVar10;
          aaStack_cc0[0]._0_8_ = plVar7[3];
          local_cd8._0_8_ = pcVar13;
        }
        else {
          local_cd8._16_8_ = *psVar10;
          local_cd8._0_8_ = (size_type *)*plVar7;
        }
        local_cd8._8_8_ = plVar7[1];
        *plVar7 = (long)psVar10;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        Matrix::setName(&local_950,(string *)local_cd8);
        if ((pointer)local_cd8._0_8_ != pcVar13) {
          operator_delete((void *)local_cd8._0_8_,local_cd8._16_8_ + 1);
        }
        if (local_b50.super_Physical._vptr_Physical !=
            (_func_int **)&local_b50.super_Physical.physicalDescription._M_string_length) {
          operator_delete(local_b50.super_Physical._vptr_Physical,
                          local_b50.super_Physical.physicalDescription._M_string_length + 1);
        }
        if (local_d68 != &local_d58) {
          operator_delete(local_d68,(ulong)(local_d58 + 1));
        }
        if ((pointer)local_a50._0_8_ != pcVar4) {
          operator_delete((void *)local_a50._0_8_,(ulong)(local_a50._16_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d28._M_dataplus._M_p != &local_d28.field_2) {
          operator_delete(local_d28._M_dataplus._M_p,local_d28.field_2._M_allocated_capacity + 1);
        }
        if (local_d48 != &local_d38) {
          operator_delete(local_d48,local_d38 + 1);
        }
        Physical::Physical(&local_620,&((this->super_Estimator).pSource)->super_Physical);
        Matrix::setPhysical(&local_950,&local_620);
        Physical::~Physical(&local_620);
        Physical::Physical(&local_6b8,&((this->super_Estimator).estimatorTime)->super_Physical);
        Matrix::setPhysical(&local_950,0,&local_6b8);
        Physical::~Physical(&local_6b8);
        Physical::Physical(&local_750,&((this->super_Estimator).pSource)->super_Physical);
        Matrix::setPhysical(&local_950,1,&local_750);
        Physical::~Physical(&local_750);
        Physical::Physical((Physical *)local_cd8);
        local_bb0._M_dataplus._M_p = (pointer)&local_bb0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_bb0,"probability","");
        Physical::setDescription((Physical *)local_cd8,&local_bb0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_bb0._M_dataplus._M_p != &local_bb0.field_2) {
          operator_delete(local_bb0._M_dataplus._M_p,local_bb0.field_2._M_allocated_capacity + 1);
        }
        Physical::Physical(&local_7e8,(Physical *)local_cd8);
        Matrix::setPhysical(&local_950,2,&local_7e8);
        Physical::~Physical(&local_7e8);
        Physical::~Physical((Physical *)local_cd8);
      }
      uVar15 = this->nDist;
      if (uVar15 != 0) {
        uVar9 = (ulong)this->nLength;
        uVar16 = 0;
        do {
          iVar6 = (int)uVar9;
          uVar9 = 0;
          i = (int)uVar16;
          if (iVar6 != 0) {
            uVar15 = 0;
            do {
              local_d00 = (double)(uVar15 & 0xffffffff) * this->dDistScale *
                          ((this->super_Estimator).estimatorTime)->dt + this->dDistOffset;
              Matrix::operator[]((Matrix *)local_a50,&local_950,(int)uVar15);
              Matrix::operator[](&local_b50,(Matrix *)local_a50,i);
              Matrix::operator[]((Matrix *)local_cd8,&local_b50,0);
              Matrix::operator=((Matrix *)local_cd8,local_d00);
              Matrix::~Matrix((Matrix *)local_cd8);
              Matrix::~Matrix(&local_b50);
              Matrix::~Matrix((Matrix *)local_a50);
              local_d00 = this->aDist[uVar15][uVar16];
              Matrix::operator[]((Matrix *)local_a50,&local_950,(int)uVar15);
              Matrix::operator[](&local_b50,(Matrix *)local_a50,i);
              Matrix::operator[]((Matrix *)local_cd8,&local_b50,1);
              Matrix::operator=((Matrix *)local_cd8,local_d00 / local_d08);
              Matrix::~Matrix((Matrix *)local_cd8);
              Matrix::~Matrix(&local_b50);
              Matrix::~Matrix((Matrix *)local_a50);
              uVar15 = uVar15 + 1;
              uVar9 = (ulong)this->nLength;
            } while (uVar15 < uVar9);
            uVar15 = this->nDist;
          }
          uVar16 = (ulong)(i + 1);
        } while (uVar16 < uVar15);
      }
      __return_storage_ptr__ = local_bd8;
      Matrix::Matrix(local_bd8,&local_950);
      goto LAB_00142222;
    }
    Matrix::Matrix(&local_950,this->nLength,2);
    local_950.super_Physical._vptr_Physical = (_func_int **)&PTR__Matrix_0015b990;
    pcVar13 = local_cd8 + 0x10;
    local_cd8._0_8_ = pcVar13;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_cd8,"process mean","");
    Matrix::setName(&local_950,(string *)local_cd8);
    if ((pointer)local_cd8._0_8_ != pcVar13) {
      operator_delete((void *)local_cd8._0_8_,local_cd8._16_8_ + 1);
    }
    pSVar3 = (this->super_Estimator).pSource;
    if (pSVar3 != (StochasticProcess *)0x0) {
      pcVar4 = (pSVar3->super_Parametric).parametricName._M_dataplus._M_p;
      local_d48 = &local_d38;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d48,pcVar4,
                 pcVar4 + (pSVar3->super_Parametric).parametricName._M_string_length);
      plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_d48,0,(char *)0x0,0x14c084);
      psVar10 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_d28.field_2._M_allocated_capacity = *psVar10;
        local_d28.field_2._8_8_ = plVar7[3];
        local_d28._M_dataplus._M_p = (pointer)&local_d28.field_2;
      }
      else {
        local_d28.field_2._M_allocated_capacity = *psVar10;
        local_d28._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_d28._M_string_length = plVar7[1];
      *plVar7 = (long)psVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_d28);
      pcVar4 = local_a50 + 0x10;
      plVar11 = plVar7 + 2;
      if ((long *)*plVar7 == plVar11) {
        local_a50._16_8_ = *plVar11;
        aaStack_a38[0]._0_4_ = (undefined4)plVar7[3];
        aaStack_a38[0]._4_4_ = *(undefined4 *)((long)plVar7 + 0x1c);
        local_a50._0_8_ = pcVar4;
      }
      else {
        local_a50._16_8_ = *plVar11;
        local_a50._0_8_ = (long *)*plVar7;
      }
      local_a50._8_8_ = plVar7[1];
      *plVar7 = (long)plVar11;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      pSVar3 = (this->super_Estimator).pSource;
      pcVar14 = (pSVar3->super_Parametric).parametricType._M_dataplus._M_p;
      local_d68 = &local_d58;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d68,pcVar14,
                 pcVar14 + (pSVar3->super_Parametric).parametricType._M_string_length);
      pcVar14 = (pointer)0xf;
      if ((pointer)local_a50._0_8_ != pcVar4) {
        pcVar14 = (pointer)local_a50._16_8_;
      }
      if (pcVar14 < (pointer)(local_a50._8_8_ + local_d60)) {
        pcVar14 = (pointer)0xf;
        if (local_d68 != &local_d58) {
          pcVar14 = local_d58;
        }
        if (pcVar14 < (pointer)(local_a50._8_8_ + local_d60)) goto LAB_00141520;
        puVar8 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_d68,0,(char *)0x0,local_a50._0_8_);
      }
      else {
LAB_00141520:
        puVar8 = (undefined8 *)std::__cxx11::string::_M_append(local_a50,(ulong)local_d68);
      }
      local_b50.super_Physical._vptr_Physical =
           (_func_int **)&local_b50.super_Physical.physicalDescription._M_string_length;
      psVar10 = puVar8 + 2;
      if ((size_type *)*puVar8 == psVar10) {
        local_b50.super_Physical.physicalDescription._M_string_length = *psVar10;
        local_b50.super_Physical.physicalDescription.field_2._M_allocated_capacity = puVar8[3];
      }
      else {
        local_b50.super_Physical.physicalDescription._M_string_length = *psVar10;
        local_b50.super_Physical._vptr_Physical = (_func_int **)*puVar8;
      }
      local_b50.super_Physical.physicalDescription._M_dataplus._M_p = (pointer)puVar8[1];
      *puVar8 = psVar10;
      puVar8[1] = 0;
      *(undefined1 *)psVar10 = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_b50);
      psVar10 = (size_type *)(plVar7 + 2);
      if ((size_type *)*plVar7 == psVar10) {
        local_cd8._16_8_ = *psVar10;
        aaStack_cc0[0]._0_8_ = plVar7[3];
        local_cd8._0_8_ = pcVar13;
      }
      else {
        local_cd8._16_8_ = *psVar10;
        local_cd8._0_8_ = (size_type *)*plVar7;
      }
      local_cd8._8_8_ = plVar7[1];
      *plVar7 = (long)psVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      Matrix::setName(&local_950,(string *)local_cd8);
      if ((pointer)local_cd8._0_8_ != pcVar13) {
        operator_delete((void *)local_cd8._0_8_,local_cd8._16_8_ + 1);
      }
      if (local_b50.super_Physical._vptr_Physical !=
          (_func_int **)&local_b50.super_Physical.physicalDescription._M_string_length) {
        operator_delete(local_b50.super_Physical._vptr_Physical,
                        local_b50.super_Physical.physicalDescription._M_string_length + 1);
      }
      if (local_d68 != &local_d58) {
        operator_delete(local_d68,(ulong)(local_d58 + 1));
      }
      if ((pointer)local_a50._0_8_ != pcVar4) {
        operator_delete((void *)local_a50._0_8_,(ulong)(local_a50._16_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d28._M_dataplus._M_p != &local_d28.field_2) {
        operator_delete(local_d28._M_dataplus._M_p,local_d28.field_2._M_allocated_capacity + 1);
      }
      if (local_d48 != &local_d38) {
        operator_delete(local_d48,local_d38 + 1);
      }
      Physical::Physical(&local_290,&((this->super_Estimator).pSource)->super_Physical);
      Matrix::setPhysical(&local_950,&local_290);
      Physical::~Physical(&local_290);
      Physical::Physical(&local_328,&((this->super_Estimator).estimatorTime)->super_Physical);
      Matrix::setPhysical(&local_950,0,&local_328);
      Physical::~Physical(&local_328);
      Physical::Physical(&local_3c0,&((this->super_Estimator).pSource)->super_Physical);
      Matrix::setPhysical(&local_950,1,&local_3c0);
      Physical::~Physical(&local_3c0);
    }
    if (this->nLength != 0) {
      uVar15 = 0;
      do {
        dVar1 = ((this->super_Estimator).estimatorTime)->dt;
        Matrix::operator[](&local_b50,&local_950,(int)uVar15);
        Matrix::operator[]((Matrix *)local_cd8,&local_b50,0);
        Matrix::operator=((Matrix *)local_cd8,(double)(uVar15 & 0xffffffff) * dVar1);
        Matrix::~Matrix((Matrix *)local_cd8);
        Matrix::~Matrix(&local_b50);
        dVar1 = this->aOne[uVar15];
        Matrix::operator[](&local_b50,&local_950,(int)uVar15);
        Matrix::operator[]((Matrix *)local_cd8,&local_b50,1);
        Matrix::operator=((Matrix *)local_cd8,dVar1 / local_d08);
        Matrix::~Matrix((Matrix *)local_cd8);
        Matrix::~Matrix(&local_b50);
        uVar15 = uVar15 + 1;
      } while (uVar15 < this->nLength);
    }
    Matrix::Matrix(__return_storage_ptr__,&local_950);
    goto LAB_00142222;
  }
  Matrix::Matrix(&local_950,this->nLength,2);
  local_950.super_Physical._vptr_Physical = (_func_int **)&PTR__Matrix_0015b990;
  pcVar13 = local_cd8 + 0x10;
  local_cd8._0_8_ = pcVar13;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_cd8,"process sample","");
  Matrix::setName(&local_950,(string *)local_cd8);
  if ((pointer)local_cd8._0_8_ != pcVar13) {
    operator_delete((void *)local_cd8._0_8_,local_cd8._16_8_ + 1);
  }
  pSVar3 = (this->super_Estimator).pSource;
  if (pSVar3 != (StochasticProcess *)0x0) {
    pcVar4 = (pSVar3->super_Parametric).parametricName._M_dataplus._M_p;
    local_d48 = &local_d38;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d48,pcVar4,
               pcVar4 + (pSVar3->super_Parametric).parametricName._M_string_length);
    plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_d48,0,(char *)0x0,0x14c05a);
    psVar10 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_d28.field_2._M_allocated_capacity = *psVar10;
      local_d28.field_2._8_8_ = plVar7[3];
      local_d28._M_dataplus._M_p = (pointer)&local_d28.field_2;
    }
    else {
      local_d28.field_2._M_allocated_capacity = *psVar10;
      local_d28._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_d28._M_string_length = plVar7[1];
    *plVar7 = (long)psVar10;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_d28);
    pcVar4 = local_a50 + 0x10;
    plVar11 = plVar7 + 2;
    if ((long *)*plVar7 == plVar11) {
      local_a50._16_8_ = *plVar11;
      aaStack_a38[0]._0_4_ = (undefined4)plVar7[3];
      aaStack_a38[0]._4_4_ = *(undefined4 *)((long)plVar7 + 0x1c);
      local_a50._0_8_ = pcVar4;
    }
    else {
      local_a50._16_8_ = *plVar11;
      local_a50._0_8_ = (long *)*plVar7;
    }
    local_a50._8_8_ = plVar7[1];
    *plVar7 = (long)plVar11;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    pSVar3 = (this->super_Estimator).pSource;
    pcVar14 = (pSVar3->super_Parametric).parametricType._M_dataplus._M_p;
    local_d68 = &local_d58;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d68,pcVar14,
               pcVar14 + (pSVar3->super_Parametric).parametricType._M_string_length);
    pcVar14 = (pointer)0xf;
    if ((pointer)local_a50._0_8_ != pcVar4) {
      pcVar14 = (pointer)local_a50._16_8_;
    }
    if (pcVar14 < (pointer)(local_a50._8_8_ + local_d60)) {
      pcVar14 = (pointer)0xf;
      if (local_d68 != &local_d58) {
        pcVar14 = local_d58;
      }
      if (pcVar14 < (pointer)(local_a50._8_8_ + local_d60)) goto LAB_0014100d;
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_d68,0,(char *)0x0,local_a50._0_8_);
    }
    else {
LAB_0014100d:
      puVar8 = (undefined8 *)std::__cxx11::string::_M_append(local_a50,(ulong)local_d68);
    }
    local_b50.super_Physical._vptr_Physical =
         (_func_int **)&local_b50.super_Physical.physicalDescription._M_string_length;
    psVar10 = puVar8 + 2;
    if ((size_type *)*puVar8 == psVar10) {
      local_b50.super_Physical.physicalDescription._M_string_length = *psVar10;
      local_b50.super_Physical.physicalDescription.field_2._M_allocated_capacity = puVar8[3];
    }
    else {
      local_b50.super_Physical.physicalDescription._M_string_length = *psVar10;
      local_b50.super_Physical._vptr_Physical = (_func_int **)*puVar8;
    }
    local_b50.super_Physical.physicalDescription._M_dataplus._M_p = (pointer)puVar8[1];
    *puVar8 = psVar10;
    puVar8[1] = 0;
    *(undefined1 *)psVar10 = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_b50);
    psVar10 = (size_type *)(plVar7 + 2);
    if ((size_type *)*plVar7 == psVar10) {
      local_cd8._16_8_ = *psVar10;
      aaStack_cc0[0]._0_8_ = plVar7[3];
      local_cd8._0_8_ = pcVar13;
    }
    else {
      local_cd8._16_8_ = *psVar10;
      local_cd8._0_8_ = (size_type *)*plVar7;
    }
    local_cd8._8_8_ = plVar7[1];
    *plVar7 = (long)psVar10;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    Matrix::setName(&local_950,(string *)local_cd8);
    if ((pointer)local_cd8._0_8_ != pcVar13) {
      operator_delete((void *)local_cd8._0_8_,local_cd8._16_8_ + 1);
    }
    if (local_b50.super_Physical._vptr_Physical !=
        (_func_int **)&local_b50.super_Physical.physicalDescription._M_string_length) {
      operator_delete(local_b50.super_Physical._vptr_Physical,
                      local_b50.super_Physical.physicalDescription._M_string_length + 1);
    }
    if (local_d68 != &local_d58) {
      operator_delete(local_d68,(ulong)(local_d58 + 1));
    }
    if ((pointer)local_a50._0_8_ != pcVar4) {
      operator_delete((void *)local_a50._0_8_,(ulong)(local_a50._16_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d28._M_dataplus._M_p != &local_d28.field_2) {
      operator_delete(local_d28._M_dataplus._M_p,local_d28.field_2._M_allocated_capacity + 1);
    }
    if (local_d48 != &local_d38) {
      operator_delete(local_d48,local_d38 + 1);
    }
    Physical::Physical(&local_c8,&((this->super_Estimator).pSource)->super_Physical);
    Matrix::setPhysical(&local_950,&local_c8);
    Physical::~Physical(&local_c8);
    Physical::Physical(&local_160,&((this->super_Estimator).estimatorTime)->super_Physical);
    Matrix::setPhysical(&local_950,0,&local_160);
    Physical::~Physical(&local_160);
    Physical::Physical(&local_1f8,&((this->super_Estimator).pSource)->super_Physical);
    Matrix::setPhysical(&local_950,1,&local_1f8);
    Physical::~Physical(&local_1f8);
  }
  if (this->nLength != 0) {
    uVar15 = 0;
    do {
      dVar1 = ((this->super_Estimator).estimatorTime)->dt;
      Matrix::operator[](&local_b50,&local_950,(int)uVar15);
      Matrix::operator[]((Matrix *)local_cd8,&local_b50,0);
      Matrix::operator=((Matrix *)local_cd8,(double)(uVar15 & 0xffffffff) * dVar1);
      Matrix::~Matrix((Matrix *)local_cd8);
      Matrix::~Matrix(&local_b50);
      dVar1 = this->aSample[uVar15];
      Matrix::operator[](&local_b50,&local_950,(int)uVar15);
      Matrix::operator[]((Matrix *)local_cd8,&local_b50,1);
      Matrix::operator=((Matrix *)local_cd8,dVar1);
      Matrix::~Matrix((Matrix *)local_cd8);
      Matrix::~Matrix(&local_b50);
      uVar15 = uVar15 + 1;
    } while (uVar15 < this->nLength);
  }
  Matrix::Matrix(__return_storage_ptr__,&local_950);
LAB_00142222:
  Matrix::~Matrix(&local_950);
  return __return_storage_ptr__;
}

Assistant:

Matrix ProcessEstimator::getEstimate(const Property& p)
{
	double samples = nSamples? double(nSamples): 1.0;
	if(nEstimate & EST_DIFF)
		samples *= estimatorTime->dt;
	
	if(p & nEstimate & EST_SAMPLE) {
		Graph a(nLength);
		a.setName("process sample");
		if( pSource ) {
			a.setName( "sample of " + pSource->getName() + " (" + pSource->getType() + ")" );
			a.setPhysical(*pSource);
			a.setPhysical(0, *estimatorTime );
			a.setPhysical(1, *pSource);
		}
		for(uint i=0; i<nLength; i++) {
			a[i][0] = estimatorTime->dt * (double) i;
			a[i][1] = aSample[i];
		}
		return a;
	}
	else if(p & nEstimate & EST_MEAN) {
		Graph a(nLength);
		a.setName("process mean");
		if( pSource ) {
			a.setName( "mean of " + pSource->getName() + " (" + pSource->getType() + ")" );
			a.setPhysical(*pSource);
			a.setPhysical(0, *estimatorTime );
			a.setPhysical(1, *pSource);
		}
		for(uint i=0; i<nLength; i++) {
			a[i][0] = estimatorTime->dt * (double) i;
			a[i][1] = aOne[i] / samples;
		}
		return a;
	}
	else if(p & nEstimate & EST_VAR) {
		Graph a(nLength);
		a.setName("process variance");
		if( pSource ) {
			string name = ((Physical *)pSource)->getUnit().getName();
			Unit unit = ((Physical *)pSource)->getUnit();
			Physical p(name, unit*unit);
			a.setName( "variance of " + pSource->getName() + " (" + pSource->getType() + ")" );
			a.setPhysical(p);
			a.setPhysical(0, *estimatorTime );
			a.setPhysical(1, p);
		}
		for(uint i=0; i<nLength; i++) {
			a[i][0] = estimatorTime->dt * (double) i;
			a[i][1] = (aTwo[i]/samples - (aOne[i]/samples*aOne[i]/samples));
		}
		return a;
	}
	else if( p & nEstimate & EST_DENS ) {
		Graph a(nLength, nDist);
		a.setName("process density");
		if( pSource ) {
			a.setName( "density of " + pSource->getName() + " (" + pSource->getType() + ")" );
			a.setPhysical(*pSource);
			a.setPhysical(0, *estimatorTime );
			a.setPhysical(1, *pSource);
			Physical p;
			p.setDescription("probability");
			a.setPhysical(2, p );
		}
        for(uint j=0; j<nDist; j++)
			for( uint i=0; i<nLength; i++ ) {
			a[i][j][0] = (estimatorTime->dt * (double(i) * dDistScale) + dDistOffset);
				a[i][j][1] = aDist[i][j] / samples;
			}
		return a;
	}
	return Matrix();
}